

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O1

void do_ltrack(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *ch_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  BUFFER *buffer;
  MYSQL *pMVar5;
  long lVar6;
  undefined8 *puVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string query;
  char arg2 [4608];
  char buf [4608];
  char arg1 [4608];
  long *local_38e8 [2];
  long local_38d8 [2];
  CHAR_DATA *local_38c8;
  buffer<char> local_38c0;
  char local_38a0 [504];
  char *local_36a8 [2];
  char *local_3698;
  char *local_3688;
  char *local_3678;
  char *local_3668;
  char local_3658 [4608];
  char local_2458 [4608];
  char local_1258 [4648];
  
  pcVar4 = one_argument(argument,local_1258);
  pcVar4 = one_argument(pcVar4,local_3658);
  if (local_1258[0] == '\0') {
    send_to_char("Syntax: ltrack <name, date, site> <all/new/in/out?> <#display?>\n\r",ch);
  }
  else {
    iVar2 = -1;
    if (local_3658[0] == '\0') {
      uVar10 = 0xffffffff;
    }
    else {
      bVar1 = str_cmp(local_3658,"new");
      uVar10 = 0;
      if (bVar1) {
        bVar1 = str_cmp(local_3658,"in");
        uVar10 = 1;
        if (bVar1) {
          bVar1 = str_cmp(local_3658,"out");
          uVar10 = -(uint)bVar1 | 2;
        }
      }
      if ((*pcVar4 != '\0') && (bVar1 = is_number(pcVar4), bVar1)) {
        iVar2 = atoi(pcVar4);
      }
    }
    buffer = new_buf();
    pcVar4 = local_2458;
    sprintf(pcVar4,"%d",(ulong)uVar10);
    local_3678 = "AND type=";
    if ((int)uVar10 < 0) {
      local_3678 = "";
      pcVar4 = "";
    }
    local_38c0.size_ = 0;
    local_38c0._vptr_buffer = (_func_int **)&PTR_grow_00457340;
    local_38c0.capacity_ = 500;
    fmt.size_ = 0x6b;
    fmt.data_ = 
    "SELECT * FROM logins WHERE (name RLIKE \'{}\' OR site RLIKE \'{}\' OR time RLIKE \'{}\') {}{} ORDER BY ctime DESC"
    ;
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_36a8;
    args.desc_ = 0xccccc;
    local_38c0.ptr_ = local_38a0;
    local_36a8[0] = local_1258;
    local_3698 = local_1258;
    local_3688 = local_1258;
    local_3668 = pcVar4;
    ::fmt::v9::detail::vformat_to<char>(&local_38c0,fmt,args,(locale_ref)0x0);
    local_38e8[0] = local_38d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_38e8,local_38c0.ptr_,local_38c0.ptr_ + local_38c0.size_);
    if (local_38c0.ptr_ != local_38a0) {
      operator_delete(local_38c0.ptr_,local_38c0.capacity_);
    }
    pMVar5 = open_conn();
    mysql_query(pMVar5,local_38e8[0]);
    lVar6 = mysql_store_result(pMVar5);
    if (lVar6 == 0) {
      iVar2 = mysql_field_count(pMVar5);
      if (iVar2 != 0) {
        send_to_char("Error accessing results.\n\r",ch);
      }
      send_to_char("No matching results were found.\n\r",ch);
    }
    else {
      local_38c8 = ch;
      for (uVar10 = 0;
          (puVar7 = (undefined8 *)mysql_fetch_row(lVar6), puVar7 != (undefined8 *)0x0 &&
          (((iVar2 == -1 || ((int)uVar10 < iVar2)) && (uVar10 < 300)))); uVar10 = uVar10 + 1) {
        strcpy(local_2458,(char *)puVar7[7]);
        iVar3 = atoi(local_2458);
        pcVar4 = "new";
        if (iVar3 != 0) {
          if (iVar3 == 1) {
            pcVar4 = "in";
          }
          else {
            pcVar4 = "out";
            if (iVar3 != 2) {
              pcVar4 = "?";
            }
          }
        }
        pcVar9 = "";
        pcVar8 = "";
        if (iVar3 == 2) {
          pcVar8 = (char *)puVar7[4];
          pcVar9 = " played, ";
        }
        sprintf(local_2458,"%s: %s@%s logged %s. [%s%s%s (%s) obj]\n\r",puVar7[2],*puVar7,puVar7[1],
                pcVar4,pcVar8,pcVar9,*(undefined4 *)(puVar7 + 5),*(undefined4 *)(puVar7 + 6));
        add_buf(buffer,local_2458);
      }
      mysql_free_result(lVar6);
      ch_00 = local_38c8;
      pcVar4 = buf_string(buffer);
      page_to_char(pcVar4,ch_00);
      free_buf(buffer);
    }
    mysql_close(pMVar5);
    if (local_38e8[0] != local_38d8) {
      operator_delete(local_38e8[0],local_38d8[0] + 1);
    }
  }
  return;
}

Assistant:

void do_ltrack(CHAR_DATA *ch, char *argument)
{
	MYSQL *conn;
	MYSQL_ROW row;
	MYSQL_RES *res_set;
	BUFFER *buffer;
	char arg1[MSL], arg2[MSL], buf[MSL];
	int type = -1, show = -1, i = 0;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: ltrack <name, date, site> <all/new/in/out?> <#display?>\n\r", ch);
		return;
	}

	if (arg2[0] != '\0')
	{
		if (!str_cmp(arg2, "new"))
		{
			type = 0;
		}
		else if (!str_cmp(arg2, "in"))
		{
			type = 1;
		}
		else if (!str_cmp(arg2, "out"))
		{
			type = 2;
		}

		if (argument[0] != '\0' && is_number(argument))
		{
			show = atoi(argument);
		}
	}

	buffer = new_buf();
	sprintf(buf, "%d", type);
	auto query = fmt::format("SELECT * FROM logins WHERE (name RLIKE '{}' OR site RLIKE '{}' OR time RLIKE '{}') {}{} ORDER BY ctime DESC",
		arg1,
		arg1,
		arg1,
		type > -1 ? "AND type=" : "",
		type > -1 ? buf : "");

	conn = open_conn();
	mysql_query(conn, query.c_str());
	res_set = mysql_store_result(conn);

	if (res_set == nullptr && mysql_field_count(conn) > 0)
	{
		send_to_char("Error accessing results.\n\r", ch);
	}
	else if (res_set)
	{
		while ((row = mysql_fetch_row(res_set)) != nullptr)
		{
			i++;

			if ((show != -1 && i > show) || i > 300)
				break;

			sprintf(buf, "%s", row[7]);
			type = atoi(buf);

			sprintf(buf, "%s: %s@%s logged %s. [%s%s%s (%s) obj]\n\r",
				row[2],
				row[0],
				row[1],
				type == 0 ? "new" : type == 1 ? "in" : type == 2 ? "out" : "?",
				type == 2 ? row[4] : "",
				type == 2 ? " played, " : "",
				row[5],
				row[6]);
			add_buf(buffer, buf);
		}

		mysql_free_result(res_set);
		page_to_char(buf_string(buffer), ch);
		free_buf(buffer);
		mysql_close(conn);
		return;
	}

	send_to_char("No matching results were found.\n\r", ch);
	mysql_close(conn);
	return;
}